

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

double __thiscall gulps::log(gulps *this,double __x)

{
  long *plVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  byte bVar4;
  message *in_RSI;
  _List_node_base *p_Var5;
  undefined8 *puVar6;
  bool bVar7;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double dVar8;
  double extraout_XMM0_Qa_01;
  double extraout_XMM0_Qa_02;
  double extraout_XMM0_Qa_03;
  double extraout_XMM0_Qa_04;
  double extraout_XMM0_Qa_05;
  message msg;
  message local_f0;
  
  message::message(&local_f0,in_RSI);
  p_Var5 = (this->outputs).
           super__List_base<std::unique_ptr<gulps::gulps_output,_std::default_delete<gulps::gulps_output>_>,_std::allocator<std::unique_ptr<gulps::gulps_output,_std::default_delete<gulps::gulps_output>_>_>_>
           ._M_impl._M_node.super__List_node_base._M_next;
  dVar8 = extraout_XMM0_Qa;
  if (p_Var5 != (_List_node_base *)this) {
    do {
      plVar1 = *(long **)&((list<std::unique_ptr<gulps::gulps_output,_std::default_delete<gulps::gulps_output>_>,_std::allocator<std::unique_ptr<gulps::gulps_output,_std::default_delete<gulps::gulps_output>_>_>_>
                            *)(p_Var5 + 1))->
                          super__List_base<std::unique_ptr<gulps::gulps_output,_std::default_delete<gulps::gulps_output>_>,_std::allocator<std::unique_ptr<gulps::gulps_output,_std::default_delete<gulps::gulps_output>_>_>_>
      ;
      puVar2 = (undefined8 *)plVar1[2];
      if ((undefined8 *)plVar1[1] != puVar2) {
        bVar7 = false;
        puVar3 = (undefined8 *)plVar1[1];
        do {
          puVar6 = puVar3 + 1;
          bVar4 = (*(code *)*puVar3)(&local_f0);
          if (bVar4 != 0) {
            bVar7 = true;
          }
          puVar3 = puVar6;
        } while ((puVar6 == puVar2 | bVar4) != 1);
        dVar8 = extraout_XMM0_Qa_00;
        if (bVar7) {
          dVar8 = (double)(**(code **)(*plVar1 + 0x10))(plVar1,&local_f0);
        }
      }
      p_Var5 = (((list<std::unique_ptr<gulps::gulps_output,_std::default_delete<gulps::gulps_output>_>,_std::allocator<std::unique_ptr<gulps::gulps_output,_std::default_delete<gulps::gulps_output>_>_>_>
                  *)&p_Var5->_M_next)->
               super__List_base<std::unique_ptr<gulps::gulps_output,_std::default_delete<gulps::gulps_output>_>,_std::allocator<std::unique_ptr<gulps::gulps_output,_std::default_delete<gulps::gulps_output>_>_>_>
               )._M_impl._M_node.super__List_node_base._M_next;
    } while (p_Var5 != (_List_node_base *)this);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0.text._M_dataplus._M_p != &local_f0.text.field_2) {
    operator_delete(local_f0.text._M_dataplus._M_p);
    dVar8 = extraout_XMM0_Qa_01;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0.thread_id._M_dataplus._M_p != &local_f0.thread_id.field_2) {
    operator_delete(local_f0.thread_id._M_dataplus._M_p);
    dVar8 = extraout_XMM0_Qa_02;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0.src_path._M_dataplus._M_p != &local_f0.src_path.field_2) {
    operator_delete(local_f0.src_path._M_dataplus._M_p);
    dVar8 = extraout_XMM0_Qa_03;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0.cat_minor._M_dataplus._M_p != &local_f0.cat_minor.field_2) {
    operator_delete(local_f0.cat_minor._M_dataplus._M_p);
    dVar8 = extraout_XMM0_Qa_04;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0.cat_major._M_dataplus._M_p != &local_f0.cat_major.field_2) {
    operator_delete(local_f0.cat_major._M_dataplus._M_p);
    dVar8 = extraout_XMM0_Qa_05;
  }
  return dVar8;
}

Assistant:

void log(message&& in_msg)
	{
		message msg = std::move(in_msg);
		
		for(std::unique_ptr<gulps_output>& out : outputs)
			out->log(msg);
	}